

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_ncell(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG *ncell)

{
  REF_MPI ref_mpi;
  uint uVar1;
  undefined8 in_RAX;
  undefined8 uVar2;
  char *pcVar3;
  int cell;
  undefined8 uStack_38;
  REF_INT part;
  
  ref_mpi = ref_node->ref_mpi;
  *ncell = 0;
  cell = 0;
  uStack_38 = in_RAX;
  do {
    if (ref_cell->max <= cell) {
      uVar1 = ref_mpi_allsum(ref_mpi,ncell,1,2);
      if (uVar1 == 0) {
        uVar1 = 0;
      }
      else {
        pcVar3 = "sum";
        uVar2 = 0x3d3;
LAB_0016426b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar2,"ref_cell_ncell",(ulong)uVar1,pcVar3);
      }
      return uVar1;
    }
    if (ref_cell->c2n[(long)cell * (long)ref_cell->size_per] != -1) {
      uVar1 = ref_cell_part(ref_cell,ref_node,cell,&part);
      if (uVar1 != 0) {
        pcVar3 = "cell part";
        uVar2 = 0x3cd;
        goto LAB_0016426b;
      }
      if (ref_mpi->id == part) {
        *ncell = *ncell + 1;
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_ncell(REF_CELL ref_cell, REF_NODE ref_node,
                                  REF_LONG *ncell) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, part;

  *ncell = 0;
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (ref_mpi_rank(ref_mpi) == part) {
      (*ncell)++;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, ncell, 1, REF_LONG_TYPE), "sum");

  return REF_SUCCESS;
}